

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

int32_t __thiscall fasttext::Model::getNegative(Model *this,int32_t target)

{
  int iVar1;
  long lVar2;
  reference pvVar3;
  size_type sVar4;
  int in_ESI;
  long in_RDI;
  int32_t negative;
  
  do {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf0),
                        *(size_type *)(in_RDI + 0x108));
    iVar1 = *pvVar3;
    lVar2 = *(long *)(in_RDI + 0x108);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf0));
    *(ulong *)(in_RDI + 0x108) = (lVar2 + 1U) % sVar4;
  } while (in_ESI == iVar1);
  return iVar1;
}

Assistant:

int32_t Model::getNegative(int32_t target) {
	int32_t negative;
	do {
		negative = negatives_[negpos];
		negpos = (negpos + 1) % negatives_.size();
	} while (target == negative);
	return negative;
}